

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

_Bool imap_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  imapstate iVar1;
  void *pvVar2;
  _Bool _Var3;
  int iVar4;
  char *__s;
  size_t __n;
  short *__s1;
  ulong uVar5;
  size_t id_len;
  char *id;
  imap_conn *imapc;
  IMAP *imap;
  int *resp_local;
  size_t len_local;
  char *line_local;
  connectdata *conn_local;
  
  pvVar2 = (conn->data->req).protop;
  __s = &(conn->proto).ftpc.transfertype;
  __n = strlen(__s);
  if (((len < __n + 1) || (iVar4 = memcmp(__s,line,__n), iVar4 != 0)) || (line[__n] != ' ')) {
    if ((len < 2) || (*(short *)line != 0x202a)) {
      if (((len == 3) && (iVar4 = memcmp("+",line,1), iVar4 == 0)) ||
         ((1 < len && (*(short *)line == 0x202b)))) {
        iVar1 = (conn->proto).imapc.state;
        if ((iVar1 == IMAP_AUTHENTICATE) || (iVar1 == IMAP_APPEND)) {
          *resp = 0x2b;
        }
        else {
          Curl_failf(conn->data,"Unexpected continuation response");
          *resp = -1;
        }
        conn_local._7_1_ = true;
      }
      else {
        conn_local._7_1_ = false;
      }
    }
    else {
      switch((conn->proto).imapc.state) {
      case IMAP_CAPABILITY:
        _Var3 = imap_matchresp(line,len,"CAPABILITY");
        if (!_Var3) {
          return false;
        }
        break;
      default:
        return false;
      case IMAP_LIST:
        if (((*(long *)((long)pvVar2 + 0x38) == 0) &&
            (_Var3 = imap_matchresp(line,len,"LIST"), !_Var3)) ||
           (((*(long *)((long)pvVar2 + 0x38) != 0 &&
             (_Var3 = imap_matchresp(line,len,*(char **)((long)pvVar2 + 0x38)), !_Var3)) &&
            ((((((iVar4 = strcmp(*(char **)((long)pvVar2 + 0x38),"STORE"), iVar4 != 0 ||
                 (_Var3 = imap_matchresp(line,len,"FETCH"), !_Var3)) &&
                (iVar4 = strcmp(*(char **)((long)pvVar2 + 0x38),"SELECT"), iVar4 != 0)) &&
               ((iVar4 = strcmp(*(char **)((long)pvVar2 + 0x38),"EXAMINE"), iVar4 != 0 &&
                (iVar4 = strcmp(*(char **)((long)pvVar2 + 0x38),"SEARCH"), iVar4 != 0)))) &&
              (iVar4 = strcmp(*(char **)((long)pvVar2 + 0x38),"EXPUNGE"), iVar4 != 0)) &&
             (((iVar4 = strcmp(*(char **)((long)pvVar2 + 0x38),"LSUB"), iVar4 != 0 &&
               (iVar4 = strcmp(*(char **)((long)pvVar2 + 0x38),"UID"), iVar4 != 0)) &&
              (iVar4 = strcmp(*(char **)((long)pvVar2 + 0x38),"NOOP"), iVar4 != 0)))))))) {
          return false;
        }
        break;
      case IMAP_SELECT:
        break;
      case IMAP_FETCH:
        _Var3 = imap_matchresp(line,len,"FETCH");
        if (!_Var3) {
          return false;
        }
        break;
      case IMAP_SEARCH:
        _Var3 = imap_matchresp(line,len,"SEARCH");
        if (!_Var3) {
          return false;
        }
      }
      *resp = 0x2a;
      conn_local._7_1_ = true;
    }
  }
  else {
    __s1 = (short *)(line + __n + 1);
    uVar5 = len - (__n + 1);
    if ((uVar5 < 2) || (*__s1 != 0x4b4f)) {
      if ((uVar5 < 2) || (*__s1 != 0x4f4e)) {
        if ((uVar5 < 3) || (iVar4 = memcmp(__s1,"BAD",3), iVar4 != 0)) {
          Curl_failf(conn->data,"Bad tagged response");
          *resp = -1;
        }
        else {
          *resp = 0x42;
        }
      }
      else {
        *resp = 0x4e;
      }
    }
    else {
      *resp = 0x4f;
    }
    conn_local._7_1_ = true;
  }
  return conn_local._7_1_;
}

Assistant:

static bool imap_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct IMAP *imap = conn->data->req.protop;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *id = imapc->resptag;
  size_t id_len = strlen(id);

  /* Do we have a tagged command response? */
  if(len >= id_len + 1 && !memcmp(id, line, id_len) && line[id_len] == ' ') {
    line += id_len + 1;
    len -= id_len + 1;

    if(len >= 2 && !memcmp(line, "OK", 2))
      *resp = 'O';
    else if(len >= 2 && !memcmp(line, "NO", 2))
      *resp = 'N';
    else if(len >= 3 && !memcmp(line, "BAD", 3))
      *resp = 'B';
    else {
      failf(conn->data, "Bad tagged response");
      *resp = -1;
    }

    return TRUE;
  }

  /* Do we have an untagged command response? */
  if(len >= 2 && !memcmp("* ", line, 2)) {
    switch(imapc->state) {
      /* States which are interested in untagged responses */
      case IMAP_CAPABILITY:
        if(!imap_matchresp(line, len, "CAPABILITY"))
          return FALSE;
        break;

      case IMAP_LIST:
        if((!imap->custom && !imap_matchresp(line, len, "LIST")) ||
          (imap->custom && !imap_matchresp(line, len, imap->custom) &&
           (strcmp(imap->custom, "STORE") ||
            !imap_matchresp(line, len, "FETCH")) &&
           strcmp(imap->custom, "SELECT") &&
           strcmp(imap->custom, "EXAMINE") &&
           strcmp(imap->custom, "SEARCH") &&
           strcmp(imap->custom, "EXPUNGE") &&
           strcmp(imap->custom, "LSUB") &&
           strcmp(imap->custom, "UID") &&
           strcmp(imap->custom, "NOOP")))
          return FALSE;
        break;

      case IMAP_SELECT:
        /* SELECT is special in that its untagged responses do not have a
           common prefix so accept anything! */
        break;

      case IMAP_FETCH:
        if(!imap_matchresp(line, len, "FETCH"))
          return FALSE;
        break;

      case IMAP_SEARCH:
        if(!imap_matchresp(line, len, "SEARCH"))
          return FALSE;
        break;

      /* Ignore other untagged responses */
      default:
        return FALSE;
    }

    *resp = '*';
    return TRUE;
  }

  /* Do we have a continuation response? This should be a + symbol followed by
     a space and optionally some text as per RFC-3501 for the AUTHENTICATE and
     APPEND commands and as outlined in Section 4. Examples of RFC-4959 but
     some e-mail servers ignore this and only send a single + instead. */
  if((len == 3 && !memcmp("+", line, 1)) ||
     (len >= 2 && !memcmp("+ ", line, 2))) {
    switch(imapc->state) {
      /* States which are interested in continuation responses */
      case IMAP_AUTHENTICATE:
      case IMAP_APPEND:
        *resp = '+';
        break;

      default:
        failf(conn->data, "Unexpected continuation response");
        *resp = -1;
        break;
    }

    return TRUE;
  }

  return FALSE; /* Nothing for us */
}